

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::fetchTexture
               (SurfaceAccess *dst,ConstPixelBufferAccess *src,float *texCoord,Vec4 *colorScale,
               Vec4 *colorBias)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float local_78 [8];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78[0] = *texCoord;
  local_78[1] = texCoord[1];
  local_78[2] = texCoord[2];
  local_78[3] = texCoord[3];
  local_78[4] = texCoord[2];
  local_78[5] = texCoord[1];
  iVar11 = dst->m_height;
  if (0 < iVar11) {
    iVar4 = dst->m_width;
    iVar10 = 0;
    do {
      if (0 < iVar4) {
        local_58 = ZEXT416((uint)((float)iVar10 + 0.5));
        iVar11 = 0;
        do {
          auVar16._0_4_ = (float)iVar11 + 0.5;
          auVar16._4_4_ = local_58._0_4_;
          auVar16._8_4_ = 0;
          auVar16._12_4_ = local_58._4_4_;
          auVar17._0_4_ = (float)iVar4;
          auVar17._4_4_ = (float)dst->m_height;
          auVar17._8_8_ = 0;
          auVar17 = divps(auVar16,auVar17);
          fVar15 = auVar17._4_4_;
          bVar2 = 1.0 <= auVar17._0_4_ + fVar15;
          if (bVar2) {
            auVar17 = ZEXT416((uint)(1.0 - auVar17._0_4_));
            if (!bVar2) goto LAB_018c1ea2;
LAB_018c1e90:
            fVar12 = auVar17._0_4_;
            fVar15 = 1.0 - fVar15;
          }
          else {
            if (bVar2) goto LAB_018c1e90;
LAB_018c1ea2:
            fVar12 = auVar17._0_4_;
          }
          uVar3 = (ulong)bVar2;
          fVar13 = local_78[uVar3 * 3];
          uVar9 = 0;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&local_48,(int)src,
                     (int)((local_78[uVar3 * 3 + 1] - fVar13) * fVar15 +
                          (local_78[uVar3 * 3 + 2] - fVar13) * fVar12 + fVar13),0);
          fVar15 = colorBias->m_data[0] + colorScale->m_data[0] * local_48;
          fVar12 = colorBias->m_data[1] + colorScale->m_data[1] * fStack_44;
          fVar13 = colorBias->m_data[2] + colorScale->m_data[2] * fStack_40;
          fVar14 = colorBias->m_data[3] + colorScale->m_data[3] * fStack_3c;
          bVar1 = dst->m_colorMask;
          uVar5 = 0;
          if ((bVar1 & 1) != 0) {
            uVar6 = 0x7e - ((int)fVar15 >> 0x17);
            uVar5 = (((uint)fVar15 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar6 & 0x1f)) +
                    0x800000;
            if (8 < uVar6) {
              uVar5 = uVar6;
            }
            uVar5 = uVar5 >> 0x18;
          }
          if ((bVar1 & 2) != 0) {
            uVar6 = 0x7e - ((int)fVar12 >> 0x17);
            uVar9 = (((uint)fVar12 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar6 & 0x1f)) +
                    0x800000;
            if (8 < uVar6) {
              uVar9 = uVar6;
            }
            uVar9 = uVar9 >> 0x10 & 0xff00;
          }
          uVar6 = 0;
          if ((bVar1 & 4) != 0) {
            uVar7 = 0x7e - ((int)fVar13 >> 0x17);
            uVar6 = (((uint)fVar13 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) +
                    0x800000;
            if (8 < uVar7) {
              uVar6 = uVar7;
            }
            uVar6 = uVar6 >> 8 & 0xff0000;
          }
          uVar7 = 0xff000000;
          if ((bVar1 & 8) != 0) {
            uVar8 = 0x7e - ((int)fVar14 >> 0x17);
            uVar7 = (((uint)fVar14 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar8 & 0x1f)) +
                    0x800000;
            if (8 < uVar8) {
              uVar7 = uVar8;
            }
            uVar7 = uVar7 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)(dst->m_x + iVar11 + (dst->m_y + iVar10) * dst->m_surface->m_width) * 4) =
               uVar9 | uVar5 | uVar6 | uVar7;
          iVar11 = iVar11 + 1;
          iVar4 = dst->m_width;
        } while (iVar11 < iVar4);
        iVar11 = dst->m_height;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar11);
  }
  return;
}

Assistant:

void fetchTexture (const tcu::SurfaceAccess& dst, const tcu::ConstPixelBufferAccess& src, const float* texCoord, const tcu::Vec4& colorScale, const tcu::Vec4& colorBias)
{
	const tcu::Vec4		sq			= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);
	const tcu::Vec3		triS[2]		= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			const float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			const float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			const int	triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			const float	triX	= triNdx ? 1.0f-xf : xf;
			const float	triY	= triNdx ? 1.0f-yf : yf;

			const float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);

			dst.setPixel(src.getPixel((int)s, 0) * colorScale + colorBias, x, y);
		}
	}
}